

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O2

string * FormatScriptError_abi_cxx11_(string *__return_storage_ptr__,ScriptError_t err)

{
  long lVar1;
  long lVar2;
  char *__s;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  lazy_ostream local_80;
  undefined1 *local_70;
  char *local_68;
  assertion_result local_60;
  undefined1 *local_48;
  undefined1 *local_40;
  char *local_38;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 == 0x2b0) {
      local_38 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_30 = "";
      local_48 = &boost::unit_test::basic_cstring<char_const>::null;
      local_40 = &boost::unit_test::basic_cstring<char_const>::null;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      file.m_end = (iterator)0x66;
      file.m_begin = (iterator)&local_38;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_48,msg);
      local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x0;
      local_60.m_message.px = (element_type *)0x0;
      local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_80.m_empty = false;
      local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113e1f0;
      local_70 = boost::unit_test::lazy_ostream::inst;
      local_68 = "Unknown scripterror enumeration value, update script_errors in script_tests.cpp.";
      boost::test_tools::tt_detail::report_assertion
                (&local_60,&local_80,1,1,WARN,0xbcb770,(size_t)&stack0xffffffffffffff70,0x66);
      boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
      __s = "";
      goto LAB_004df77c;
    }
    lVar1 = lVar2 + 0x10;
  } while (*(ScriptError_t *)((long)&script_errors[0].err + lVar2) != err);
  __s = *(char **)((long)&script_errors[0].name + lVar2);
LAB_004df77c:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::string FormatScriptError(ScriptError_t err)
{
    for (const auto& se : script_errors)
        if (se.err == err)
            return se.name;
    BOOST_ERROR("Unknown scripterror enumeration value, update script_errors in script_tests.cpp.");
    return "";
}